

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizeImage.cpp
# Opt level: O0

void resizeCube(EnvmapImage *image1,EnvmapImage *image2,Box2i *image2DataWindow,float filterRadius,
               int numSamples)

{
  bool bVar1;
  Envmap EVar2;
  Array2D<Imf_3_2::Rgba> *pAVar3;
  Rgba *__src;
  Rgba *pRVar4;
  Box *in_RDX;
  EnvmapImage *in_RSI;
  EnvmapImage *in_RDI;
  float in_XMM0_Da;
  V2f pos;
  V3f dir;
  V2f posInFace;
  int x;
  int y;
  CubeMapFace face;
  int f;
  Array2D<Imf_3_2::Rgba> *pixels;
  float radius;
  int sof;
  int h;
  int w;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  uint uVar5;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff68;
  Box *pBVar6;
  EnvmapImage *in_stack_ffffffffffffff70;
  Vec3<float> local_80;
  Rgba local_74;
  Vec2<float> local_6c;
  float local_64;
  float local_60;
  Vec3<float> local_5c;
  Vec2<float> local_50;
  int local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  Array2D<Imf_3_2::Rgba> *local_38;
  float local_30;
  int local_2c;
  int local_28;
  int local_24;
  float local_1c;
  Box *local_18;
  EnvmapImage *local_10;
  EnvmapImage *local_8;
  
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  EVar2 = EnvmapImage::type(in_RDI);
  if (EVar2 == ENVMAP_CUBE) {
    EnvmapImage::dataWindow(local_8);
    bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                      ((Box<Imath_3_2::Vec2<int>_> *)in_stack_ffffffffffffff70,
                       in_stack_ffffffffffffff68);
    if (bVar1) {
      EnvmapImage::resize(in_stack_ffffffffffffff70,
                          (Envmap)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                          (Box2i *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      local_24 = (*(int *)(local_18 + 8) - *(int *)local_18) + 1;
      local_28 = (*(int *)(local_18 + 0xc) - *(int *)(local_18 + 4)) + 1;
      pAVar3 = EnvmapImage::pixels(local_10);
      pRVar4 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](pAVar3,0);
      pAVar3 = EnvmapImage::pixels(local_8);
      __src = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](pAVar3,0);
      memcpy(pRVar4,__src,(long)local_24 * 8 * (long)local_28);
      return;
    }
  }
  EVar2 = (Envmap)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_2c = Imf_3_2::CubeMap::sizeOfFace(local_18);
  local_30 = (local_1c * 1.5) / (float)local_2c;
  EnvmapImage::resize(in_stack_ffffffffffffff70,EVar2,
                      (Box2i *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  EnvmapImage::clear(in_stack_ffffffffffffff70);
  local_38 = EnvmapImage::pixels(local_10);
  for (local_3c = 0; (int)local_3c < 6; local_3c = local_3c + 1) {
    local_40 = local_3c;
    for (local_44 = 0; local_44 < local_2c; local_44 = local_44 + 1) {
      for (local_48 = 0; local_48 < local_2c; local_48 = local_48 + 1) {
        Imath_3_2::Vec2<float>::Vec2(&local_50,(float)local_48,(float)local_44);
        Imf_3_2::CubeMap::direction((CubeMapFace)&local_5c,(Box *)(ulong)local_40,(Vec2 *)local_18);
        uVar5 = local_40;
        pBVar6 = local_18;
        Imath_3_2::Vec2<float>::Vec2(&local_6c,&local_50);
        Imf_3_2::CubeMap::pixelPosition(&local_64,uVar5,pBVar6,&local_6c);
        Imath_3_2::Vec3<float>::Vec3(&local_80,&local_5c);
        local_74 = EnvmapImage::filteredLookup
                             (image2,(V3f *)image2DataWindow,filterRadius,numSamples);
        pRVar4 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_38,(long)(int)(local_60 + 0.5));
        pRVar4[(int)(local_64 + 0.5)] = local_74;
      }
    }
  }
  return;
}

Assistant:

void
resizeCube (
    const EnvmapImage& image1,
    EnvmapImage&       image2,
    const Box2i&       image2DataWindow,
    float              filterRadius,
    int                numSamples)
{
    if (image1.type () == ENVMAP_CUBE &&
        image1.dataWindow () == image2DataWindow)
    {
        //
        // Special case - the input image is a cube-face environment
        // map with the same size as the output image.  We can copy
        // the input image without resampling.
        //

        image2.resize (ENVMAP_CUBE, image2DataWindow);

        int w = image2DataWindow.max.x - image2DataWindow.min.x + 1;
        int h = image2DataWindow.max.y - image2DataWindow.min.y + 1;

        memcpy (
            &(image2.pixels ()[0][0]),
            &(image1.pixels ()[0][0]),
            sizeof (Rgba) * w * h);

        return;
    }

    //
    // Resampe the input image
    //

    int   sof    = CubeMap::sizeOfFace (image2DataWindow);
    float radius = 1.5f * filterRadius / sof;

    image2.resize (ENVMAP_CUBE, image2DataWindow);
    image2.clear ();

    Array2D<Rgba>& pixels = image2.pixels ();

    for (int f = CUBEFACE_POS_X; f <= CUBEFACE_NEG_Z; ++f)
    {
        CubeMapFace face = CubeMapFace (f);

        for (int y = 0; y < sof; ++y)
        {
            for (int x = 0; x < sof; ++x)
            {
                V2f posInFace (x, y);

                V3f dir =
                    CubeMap::direction (face, image2DataWindow, posInFace);

                V2f pos =
                    CubeMap::pixelPosition (face, image2DataWindow, posInFace);

                pixels[int (pos.y + 0.5f)][int (pos.x + 0.5f)] =
                    image1.filteredLookup (dir, radius, numSamples);
            }
        }
    }
}